

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmMakefileTargetGenerator::GetClangTidyReplacementsFilePath
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *directory,
          cmSourceFile *source,string *config)

{
  string *psVar1;
  cmLocalGenerator *this_00;
  cmLocalGenerator *pcVar2;
  string *psVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_1b0;
  string local_190;
  string local_170;
  long *local_150;
  undefined8 local_148;
  long local_140 [2];
  undefined8 local_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  size_type local_90;
  long *local_88;
  string *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  psVar1 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  this_00 = cmGeneratorTarget::GetLocalGenerator
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar2 = cmGeneratorTarget::GetLocalGenerator
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
  pcVar2 = cmGeneratorTarget::GetLocalGenerator
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  (*(pcVar2->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])
            (&local_150,pcVar2,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_c0.first._M_str = (psVar3->_M_dataplus)._M_p;
  local_c0.first._M_len = psVar3->_M_string_length;
  local_c0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_130 = 0;
  local_128 = 1;
  local_118[0] = 0x2f;
  local_a8 = 1;
  local_98 = 0;
  local_90 = local_148;
  local_88 = local_150;
  local_e8 = local_e0;
  local_f8 = 0;
  local_f0 = 1;
  local_e0[0] = 0x2f;
  local_78 = 1;
  local_68 = 0;
  local_58 = (psVar1->_M_dataplus)._M_p;
  local_60 = psVar1->_M_string_length;
  local_50 = 0;
  local_48 = 5;
  local_40 = ".yaml";
  local_38 = 0;
  views._M_len = 6;
  views._M_array = &local_c0;
  local_120 = local_118;
  local_a0 = local_118;
  local_80 = (string *)&local_150;
  local_70 = local_e8;
  cmCatViews(&local_190,views);
  cmOutputConverter::MaybeRelativeToTopBinDir
            (&local_1b0,&this_00->super_cmOutputConverter,&local_190);
  local_c0.first._M_str = (directory->_M_dataplus)._M_p;
  local_c0.first._M_len = directory->_M_string_length;
  local_c0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_130 = 0;
  local_128 = 1;
  local_118[0] = 0x2f;
  local_a8 = 1;
  local_98 = 0;
  local_90 = local_1b0._M_string_length;
  local_88 = (long *)local_1b0._M_dataplus._M_p;
  views_00._M_len = 3;
  views_00._M_array = &local_c0;
  local_120 = local_118;
  local_a0 = local_118;
  local_80 = &local_1b0;
  cmCatViews(&local_170,views_00);
  cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetClangTidyReplacementsFilePath(
  std::string const& directory, cmSourceFile const& source,
  std::string const& config) const
{
  (void)config;
  auto const& objectName = this->GeneratorTarget->GetObjectName(&source);
  auto fixesFile = cmSystemTools::CollapseFullPath(cmStrCat(
    directory, '/',
    this->GeneratorTarget->GetLocalGenerator()->MaybeRelativeToTopBinDir(
      cmStrCat(this->GeneratorTarget->GetLocalGenerator()
                 ->GetCurrentBinaryDirectory(),
               '/',
               this->GeneratorTarget->GetLocalGenerator()->GetTargetDirectory(
                 this->GeneratorTarget),
               '/', objectName, ".yaml"))));
  return fixesFile;
}